

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 __thiscall anon_unknown.dwarf_145cfbe::MultiADescriptor::Clone(MultiADescriptor *this)

{
  undefined8 *puVar1;
  tuple<(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
  this_00;
  long in_RSI;
  undefined8 *puVar2;
  pointer __p;
  long in_FS_OFFSET;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  providers;
  __uniq_ptr_impl<(anonymous_namespace)::MultiADescriptor,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
  local_80;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_78;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::reserve(&local_78,*(long *)(in_RSI + 0x10) - *(long *)(in_RSI + 8) >> 3);
  puVar2 = *(undefined8 **)(in_RSI + 8);
  puVar1 = *(undefined8 **)(in_RSI + 0x10);
  if (puVar2 != puVar1) {
    do {
      (**(code **)(*(long *)*puVar2 + 0x58))(&local_58);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
      ::
      emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                  *)&local_78,
                 (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  *)&local_58);
      if (local_58.
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)&(((local_58.
                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
                     _M_head_impl)->m_expr_index)();
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  this_00.
  super__Tuple_impl<0UL,_(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
  .super__Head_base<0UL,_(anonymous_namespace)::MultiADescriptor_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
        )operator_new(0x60);
  local_58.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_58.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiADescriptor((MultiADescriptor *)
                   this_00.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::MultiADescriptor_*,_false>.
                   _M_head_impl,*(int *)(in_RSI + 0x58),&local_58,*(bool *)(in_RSI + 0x5c));
  local_80._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
  .super__Head_base<0UL,_(anonymous_namespace)::MultiADescriptor_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
        )(tuple<(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
          )this_00.
           super__Tuple_impl<0UL,_(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
           .super__Head_base<0UL,_(anonymous_namespace)::MultiADescriptor_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_58);
  local_80._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
  .super__Head_base<0UL,_(anonymous_namespace)::MultiADescriptor_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
        )(_Tuple_impl<0UL,_(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
          )0x0;
  (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor =
       (_func_int **)
       this_00.
       super__Tuple_impl<0UL,_(anonymous_namespace)::MultiADescriptor_*,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
       .super__Head_base<0UL,_(anonymous_namespace)::MultiADescriptor_*,_false>._M_head_impl;
  std::
  unique_ptr<(anonymous_namespace)::MultiADescriptor,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::MultiADescriptor,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
                 *)&local_80);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> Clone() const override
    {
        std::vector<std::unique_ptr<PubkeyProvider>> providers;
        providers.reserve(m_pubkey_args.size());
        for (const auto& arg : m_pubkey_args) {
            providers.push_back(arg->Clone());
        }
        return std::make_unique<MultiADescriptor>(m_threshold, std::move(providers), m_sorted);
    }